

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

bool __thiscall flatbuffers::php::PhpGenerator::GenerateEnums(PhpGenerator *this)

{
  bool bVar1;
  reference ppEVar2;
  undefined1 local_50 [8];
  string enumcode;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_20;
  const_iterator it;
  PhpGenerator *this_local;
  
  it._M_current = (EnumDef **)this;
  local_20._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    enum_def = (EnumDef *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_20);
    enumcode.field_2._8_8_ = *ppEVar2;
    std::__cxx11::string::string((string *)local_50);
    GenEnum((EnumDef *)enumcode.field_2._8_8_,(string *)local_50);
    bVar1 = SaveType(this,(Definition *)enumcode.field_2._8_8_,(string *)local_50,false);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_50);
    if (!bVar1) goto LAB_002dc37e;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_20);
  }
  this_local._7_1_ = 1;
LAB_002dc37e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GenerateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (!SaveType(enum_def, enumcode, false)) return false;
    }
    return true;
  }